

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.h
# Opt level: O1

CRuleSet * allocator_default<CDoodadsMapper::CRuleSet>::alloc_array(int size)

{
  long lVar1;
  undefined1 auVar2 [16];
  ulong *puVar3;
  ulong uVar4;
  array<CDoodadsMapper::CRule,_allocator_default<CDoodadsMapper::CRule>_> *this;
  ulong uVar5;
  long lVar6;
  
  uVar5 = (ulong)size;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar5;
  uVar4 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0x90),8) == 0) {
    uVar4 = SUB168(auVar2 * ZEXT816(0x90),0) | 8;
  }
  puVar3 = (ulong *)operator_new__(uVar4);
  *puVar3 = uVar5;
  if (size != 0) {
    this = (array<CDoodadsMapper::CRule,_allocator_default<CDoodadsMapper::CRule>_> *)
           (puVar3 + 0x11);
    lVar6 = -8;
    do {
      this->list = (CRule *)0x0;
      array<CDoodadsMapper::CRule,_allocator_default<CDoodadsMapper::CRule>_>::clear(this);
      this = this + 9;
      lVar1 = lVar6 + uVar5 * 0x90;
      lVar6 = lVar6 + -0x90;
    } while (lVar1 != 0x88);
  }
  return (CRuleSet *)(puVar3 + 1);
}

Assistant:

static T *alloc_array(int size) { return new T [size]; }